

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O1

_Bool trans_VMOV_from_gp(DisasContext_conflict1 *s,arg_VMOV_from_gp *a)

{
  int reg;
  TCGContext_conflict1 *tcg_ctx;
  TCGContext_conflict1 *s_00;
  byte bVar1;
  _Bool _Var2;
  uint pass;
  TCGTemp *pTVar3;
  TCGv_i32 arg1;
  uint uVar4;
  TCGv_i32 var;
  uint local_40;
  
  tcg_ctx = s->uc->tcg_ctx;
  if (a->size == 2) {
    bVar1 = (byte)s->isar->mvfr0 & 0xf0;
  }
  else {
    bVar1 = *(byte *)((long)&s->features + 1) & 1;
  }
  if ((bVar1 == 0) || (((s->isar->mvfr0 & 0xe) == 0 && ((a->vn & 0x10) != 0)))) {
    return false;
  }
  uVar4 = a->index << ((byte)a->size & 0x1f);
  _Var2 = full_vfp_access_check(s,false);
  if (!_Var2) {
    return true;
  }
  pass = uVar4 >> 2 & 1;
  reg = a->rt;
  s_00 = s->uc->tcg_ctx;
  pTVar3 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
  var = (TCGv_i32)((long)pTVar3 - (long)s_00);
  load_reg_var(s,var,reg);
  if (a->size == 0) {
    local_40 = 8;
  }
  else {
    if (a->size != 1) goto LAB_00662d78;
    local_40 = 0x10;
  }
  arg1 = neon_load_reg(tcg_ctx,a->vn,pass);
  tcg_gen_deposit_i32_aarch64(tcg_ctx,var,arg1,var,(uVar4 & 3) << 3,local_40);
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(arg1 + (long)tcg_ctx));
LAB_00662d78:
  neon_store_reg(tcg_ctx,a->vn,pass,var);
  return true;
}

Assistant:

static bool trans_VMOV_from_gp(DisasContext *s, arg_VMOV_from_gp *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    /* VMOV general purpose register to scalar */
    TCGv_i32 tmp, tmp2;
    int pass;
    uint32_t offset;

    /* SIZE == 2 is a VFP instruction; otherwise NEON.  */
    if (a->size == 2
        ? !dc_isar_feature(aa32_fpsp_v2, s)
        : !arm_dc_feature(s, ARM_FEATURE_NEON)) {
        return false;
    }

    /* UNDEF accesses to D16-D31 if they don't exist */
    if (!dc_isar_feature(aa32_simd_r32, s) && (a->vn & 0x10)) {
        return false;
    }

    offset = a->index << a->size;
    pass = extract32(offset, 2, 1);
    offset = extract32(offset, 0, 2) * 8;

    if (!vfp_access_check(s)) {
        return true;
    }

    tmp = load_reg(s, a->rt);
    switch (a->size) {
    case 0:
        tmp2 = neon_load_reg(tcg_ctx, a->vn, pass);
        tcg_gen_deposit_i32(tcg_ctx, tmp, tmp2, tmp, offset, 8);
        tcg_temp_free_i32(tcg_ctx, tmp2);
        break;
    case 1:
        tmp2 = neon_load_reg(tcg_ctx, a->vn, pass);
        tcg_gen_deposit_i32(tcg_ctx, tmp, tmp2, tmp, offset, 16);
        tcg_temp_free_i32(tcg_ctx, tmp2);
        break;
    case 2:
        break;
    }
    neon_store_reg(tcg_ctx, a->vn, pass, tmp);

    return true;
}